

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

void gcm_mult_smalltable(uint8_t *output,uint8_t *x,uint64_t (*H) [2])

{
  byte bVar1;
  uint64_t (*pauVar2) [2];
  uint64_t x_2;
  size_t i_2;
  uint64_t x_1;
  size_t i_1;
  uint64_t r_1;
  uint64_t r;
  uint64_t r_3;
  uint64_t r_2;
  uint64_t r_5;
  uint64_t r_4;
  ulong local_178 [3];
  byte local_15e;
  int local_15c;
  uint64_t (*local_158) [2];
  uint8_t *local_150;
  ulong *local_148;
  ulong local_118;
  ulong local_110;
  uint64_t (*local_108) [2];
  ulong *local_100;
  ulong *local_f8;
  ulong local_d8;
  ulong local_d0;
  uint64_t (*local_c8) [2];
  ulong *local_c0;
  ulong *local_b8;
  ulong local_98;
  ulong local_90;
  uint64_t (*local_88) [2];
  uint8_t *u8z;
  uint64_t *pu64z;
  uint64_t u64z [2];
  uchar rem;
  uchar hi;
  uchar lo;
  int i;
  uint64_t (*H_local) [2];
  uint8_t *x_local;
  uint8_t *output_local;
  uint64_t x_3;
  size_t i_3;
  
  pauVar2 = H + (x[0xf] & 0xf);
  local_178[1] = (*pauVar2)[0] << 0x3c | (*pauVar2)[1] >> 4;
  local_178[0] = (ulong)last4[(byte)(*pauVar2)[1] & 0xf] << 0x30 ^ (*pauVar2)[0] >> 4;
  local_88 = H + (byte)((int)(uint)x[0xf] >> 4);
  local_90 = 0x10;
  local_158 = H;
  local_150 = x;
  local_148 = (ulong *)output;
  u8z = (uint8_t *)local_178;
  pu64z = local_178;
  for (local_98 = 0; local_98 + 8 <= local_90; local_98 = local_98 + 8) {
    *(ulong *)((long)pu64z + local_98) =
         *(ulong *)(u8z + local_98) ^ *(ulong *)((long)*local_88 + local_98);
  }
  for (; local_98 < local_90; local_98 = local_98 + 1) {
    *(byte *)((long)pu64z + local_98) = u8z[local_98] ^ *(byte *)((long)*local_88 + local_98);
  }
  for (local_15c = 0xe; -1 < local_15c; local_15c = local_15c + -1) {
    local_15e = (byte)((int)(uint)local_150[local_15c] >> 4);
    bVar1 = (byte)local_178[1];
    local_178[1] = local_178[0] << 0x3c | local_178[1] >> 4;
    local_178[0] = (ulong)last4[bVar1 & 0xf] << 0x30 ^ local_178[0] >> 4;
    local_c8 = local_158 + (local_150[local_15c] & 0xf);
    local_d0 = 0x10;
    local_c0 = local_178;
    local_b8 = local_178;
    for (local_d8 = 0; local_d8 + 8 <= local_d0; local_d8 = local_d8 + 8) {
      *(ulong *)((long)local_b8 + local_d8) =
           *(ulong *)((long)local_c0 + local_d8) ^ *(ulong *)((long)*local_c8 + local_d8);
    }
    for (; local_d8 < local_d0; local_d8 = local_d8 + 1) {
      *(byte *)((long)local_b8 + local_d8) =
           *(byte *)((long)local_c0 + local_d8) ^ *(byte *)((long)*local_c8 + local_d8);
    }
    bVar1 = (byte)local_178[1];
    local_178[1] = local_178[0] << 0x3c | local_178[1] >> 4;
    local_178[0] = (ulong)last4[bVar1 & 0xf] << 0x30 ^ local_178[0] >> 4;
    local_108 = local_158 + local_15e;
    local_110 = 0x10;
    local_100 = local_178;
    local_f8 = local_178;
    for (local_118 = 0; local_118 + 8 <= local_110; local_118 = local_118 + 8) {
      *(ulong *)((long)local_f8 + local_118) =
           *(ulong *)((long)local_100 + local_118) ^ *(ulong *)((long)*local_108 + local_118);
    }
    for (; local_118 < local_110; local_118 = local_118 + 1) {
      *(byte *)((long)local_f8 + local_118) =
           *(byte *)((long)local_100 + local_118) ^ *(byte *)((long)*local_108 + local_118);
    }
  }
  *local_148 = local_178[0] >> 0x38 | (local_178[0] & 0xff000000000000) >> 0x28 |
               (local_178[0] & 0xff0000000000) >> 0x18 | (local_178[0] & 0xff00000000) >> 8 |
               (local_178[0] & 0xff000000) << 8 | (local_178[0] & 0xff0000) << 0x18 |
               (local_178[0] & 0xff00) << 0x28 | local_178[0] << 0x38;
  local_148[1] = local_178[1] >> 0x38 | (local_178[1] & 0xff000000000000) >> 0x28 |
                 (local_178[1] & 0xff0000000000) >> 0x18 | (local_178[1] & 0xff00000000) >> 8 |
                 (local_178[1] & 0xff000000) << 8 | (local_178[1] & 0xff0000) << 0x18 |
                 (local_178[1] & 0xff00) << 0x28 | local_178[1] << 0x38;
  return;
}

Assistant:

static void gcm_mult_smalltable(uint8_t *output, const uint8_t *x, uint64_t H[16][2])
{
    int i = 0;
    unsigned char lo, hi, rem;
    uint64_t u64z[2];
    const uint64_t *pu64z = NULL;
    uint8_t *u8z = (uint8_t *) u64z;

    lo = x[15] & 0xf;
    hi = (x[15] >> 4) & 0xf;

    pu64z = H[lo];

    rem = (unsigned char) pu64z[1] & 0xf;
    u64z[1] = (pu64z[0] << 60) | (pu64z[1] >> 4);
    u64z[0] = (pu64z[0] >> 4);
    u64z[0] ^= (uint64_t) last4[rem] << 48;
    mbedtls_xor_no_simd(u8z, u8z, (uint8_t *) H[hi], 16);

    for (i = 14; i >= 0; i--) {
        lo = x[i] & 0xf;
        hi = (x[i] >> 4) & 0xf;

        rem = (unsigned char) u64z[1] & 0xf;
        u64z[1] = (u64z[0] << 60) | (u64z[1] >> 4);
        u64z[0] = (u64z[0] >> 4);
        u64z[0] ^= (uint64_t) last4[rem] << 48;
        mbedtls_xor_no_simd(u8z, u8z, (uint8_t *) H[lo], 16);

        rem = (unsigned char) u64z[1] & 0xf;
        u64z[1] = (u64z[0] << 60) | (u64z[1] >> 4);
        u64z[0] = (u64z[0] >> 4);
        u64z[0] ^= (uint64_t) last4[rem] << 48;
        mbedtls_xor_no_simd(u8z, u8z, (uint8_t *) H[hi], 16);
    }

    MBEDTLS_PUT_UINT64_BE(u64z[0], output, 0);
    MBEDTLS_PUT_UINT64_BE(u64z[1], output, 8);
}